

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Expr * exprDup(sqlite3 *db,Expr *p,int dupFlags,u8 **pzBuffer)

{
  uint uVar1;
  u8 **ppuVar2;
  sqlite3 *db_00;
  int iVar3;
  Expr *pOwner;
  size_t sVar4;
  Select *pSVar5;
  Expr *pEVar6;
  Window *pWVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  Expr *local_50;
  int local_48;
  uint local_44;
  u8 **local_40;
  sqlite3 *local_38;
  
  if (pzBuffer == (u8 **)0x0) {
    iVar3 = dupedExprSize(p,dupFlags);
    pOwner = (Expr *)sqlite3DbMallocRawNN(db,(long)iVar3);
    local_44 = 0;
  }
  else {
    pOwner = (Expr *)*pzBuffer;
    local_44 = 0x8000000;
  }
  if (pOwner != (Expr *)0x0) {
    uVar9 = 0x48;
    if ((((dupFlags != 0) && (p->op != 0xb2)) && ((p->flags & 0x1000000) == 0)) &&
       (uVar9 = 0x402c, p->pLeft == (Expr *)0x0)) {
      uVar9 = 0x402c;
      if ((p->x).pList == (ExprList *)0x0) {
        uVar9 = 0x10010;
      }
    }
    uVar1 = p->flags;
    uVar10 = 0;
    local_50 = pOwner;
    local_48 = dupFlags;
    local_40 = pzBuffer;
    local_38 = db;
    if (((uVar1 >> 0xb & 1) == 0) && ((p->u).zToken != (char *)0x0)) {
      sVar4 = strlen((p->u).zToken);
      uVar10 = ((uint)sVar4 & 0x3fffffff) + 1;
    }
    if (local_48 == 0) {
      uVar8 = 0x2c;
      if ((uVar1 >> 0xe & 1) == 0) {
        uVar8 = 0x48;
      }
      sVar4 = 0x10;
      if ((uVar1 >> 0x10 & 1) == 0) {
        sVar4 = (size_t)uVar8;
      }
      memcpy(pOwner,p,sVar4);
      if ((uint)sVar4 < 0x48) {
        memset(&local_50->op + sVar4,0,0x48 - sVar4);
      }
    }
    else {
      memcpy(pOwner,p,(ulong)(uVar9 & 0x7c));
    }
    pOwner->flags = uVar9 & 0x14000 | local_44 | pOwner->flags & 0xf7febfff;
    if (uVar10 != 0) {
      (pOwner->u).zToken = (char *)(&local_50->op + (uVar9 & 0x7c));
      memcpy(&local_50->op + (uVar9 & 0x7c),(p->u).zToken,(ulong)uVar10);
    }
    db_00 = local_38;
    iVar3 = local_48;
    if (((pOwner->flags | p->flags) & 0x810000) == 0) {
      if ((p->flags >> 0xc & 1) == 0) {
        pSVar5 = (Select *)sqlite3ExprListDup(local_38,(p->x).pList,local_48);
      }
      else {
        pSVar5 = sqlite3SelectDup(local_38,(Select *)(p->x).pList,local_48);
      }
      (pOwner->x).pList = (ExprList *)pSVar5;
    }
    uVar9 = pOwner->flags;
    if ((uVar9 & 0x1014000) == 0) {
      if ((p->flags & 0x810000) == 0) {
        pEVar6 = p->pLeft;
        if (pOwner->op != 0xb2) {
          if (pEVar6 == (Expr *)0x0) {
            pEVar6 = (Expr *)0x0;
          }
          else {
            pEVar6 = exprDup(db_00,pEVar6,0,(u8 **)0x0);
          }
        }
        pOwner->pLeft = pEVar6;
        if (p->pRight == (Expr *)0x0) {
          pEVar6 = (Expr *)0x0;
        }
        else {
          pEVar6 = exprDup(db_00,p->pRight,0,(u8 **)0x0);
        }
        pOwner->pRight = pEVar6;
      }
    }
    else {
      iVar3 = dupedExprNodeSize(p,iVar3);
      ppuVar2 = local_40;
      local_50 = (Expr *)(&local_50->op + iVar3);
      if ((uVar9 & 0x810000) == 0) {
        if (p->pLeft == (Expr *)0x0) {
          pEVar6 = (Expr *)0x0;
        }
        else {
          pEVar6 = exprDup(db_00,p->pLeft,1,(u8 **)&local_50);
        }
        pOwner->pLeft = pEVar6;
        if (p->pRight == (Expr *)0x0) {
          pEVar6 = (Expr *)0x0;
        }
        else {
          pEVar6 = exprDup(db_00,p->pRight,1,(u8 **)&local_50);
        }
        pOwner->pRight = pEVar6;
      }
      if ((p->flags & 0x1000000) != 0) {
        pWVar7 = sqlite3WindowDup(db_00,pOwner,(p->y).pWin);
        (pOwner->y).pWin = pWVar7;
      }
      if (ppuVar2 != (u8 **)0x0) {
        *ppuVar2 = &local_50->op;
      }
    }
  }
  return pOwner;
}

Assistant:

static Expr *exprDup(sqlite3 *db, const Expr *p, int dupFlags, u8 **pzBuffer){
  Expr *pNew;           /* Value to return */
  u8 *zAlloc;           /* Memory space from which to build Expr object */
  u32 staticFlag;       /* EP_Static if space not obtained from malloc */

  assert( db!=0 );
  assert( p );
  assert( dupFlags==0 || dupFlags==EXPRDUP_REDUCE );
  assert( pzBuffer==0 || dupFlags==EXPRDUP_REDUCE );

  /* Figure out where to write the new Expr structure. */
  if( pzBuffer ){
    zAlloc = *pzBuffer;
    staticFlag = EP_Static;
    assert( zAlloc!=0 );
  }else{
    zAlloc = sqlite3DbMallocRawNN(db, dupedExprSize(p, dupFlags));
    staticFlag = 0;
  }
  pNew = (Expr *)zAlloc;

  if( pNew ){
    /* Set nNewSize to the size allocated for the structure pointed to
    ** by pNew. This is either EXPR_FULLSIZE, EXPR_REDUCEDSIZE or
    ** EXPR_TOKENONLYSIZE. nToken is set to the number of bytes consumed
    ** by the copy of the p->u.zToken string (if any).
    */
    const unsigned nStructSize = dupedExprStructSize(p, dupFlags);
    const int nNewSize = nStructSize & 0xfff;
    int nToken;
    if( !ExprHasProperty(p, EP_IntValue) && p->u.zToken ){
      nToken = sqlite3Strlen30(p->u.zToken) + 1;
    }else{
      nToken = 0;
    }
    if( dupFlags ){
      assert( ExprHasProperty(p, EP_Reduced)==0 );
      memcpy(zAlloc, p, nNewSize);
    }else{
      u32 nSize = (u32)exprStructSize(p);
      memcpy(zAlloc, p, nSize);
      if( nSize<EXPR_FULLSIZE ){
        memset(&zAlloc[nSize], 0, EXPR_FULLSIZE-nSize);
      }
    }

    /* Set the EP_Reduced, EP_TokenOnly, and EP_Static flags appropriately. */
    pNew->flags &= ~(EP_Reduced|EP_TokenOnly|EP_Static);
    pNew->flags |= nStructSize & (EP_Reduced|EP_TokenOnly);
    pNew->flags |= staticFlag;
    ExprClearVVAProperties(pNew);
    if( dupFlags ){
      ExprSetVVAProperty(pNew, EP_Immutable);
    }

    /* Copy the p->u.zToken string, if any. */
    if( nToken ){
      char *zToken = pNew->u.zToken = (char*)&zAlloc[nNewSize];
      memcpy(zToken, p->u.zToken, nToken);
    }

    if( 0==((p->flags|pNew->flags) & (EP_TokenOnly|EP_Leaf)) ){
      /* Fill in the pNew->x.pSelect or pNew->x.pList member. */
      if( ExprUseXSelect(p) ){
        pNew->x.pSelect = sqlite3SelectDup(db, p->x.pSelect, dupFlags);
      }else{
        pNew->x.pList = sqlite3ExprListDup(db, p->x.pList, dupFlags);
      }
    }

    /* Fill in pNew->pLeft and pNew->pRight. */
    if( ExprHasProperty(pNew, EP_Reduced|EP_TokenOnly|EP_WinFunc) ){
      zAlloc += dupedExprNodeSize(p, dupFlags);
      if( !ExprHasProperty(pNew, EP_TokenOnly|EP_Leaf) ){
        pNew->pLeft = p->pLeft ?
                      exprDup(db, p->pLeft, EXPRDUP_REDUCE, &zAlloc) : 0;
        pNew->pRight = p->pRight ?
                       exprDup(db, p->pRight, EXPRDUP_REDUCE, &zAlloc) : 0;
      }
#ifndef SQLITE_OMIT_WINDOWFUNC
      if( ExprHasProperty(p, EP_WinFunc) ){
        pNew->y.pWin = sqlite3WindowDup(db, pNew, p->y.pWin);
        assert( ExprHasProperty(pNew, EP_WinFunc) );
      }
#endif /* SQLITE_OMIT_WINDOWFUNC */
      if( pzBuffer ){
        *pzBuffer = zAlloc;
      }
    }else{
      if( !ExprHasProperty(p, EP_TokenOnly|EP_Leaf) ){
        if( pNew->op==TK_SELECT_COLUMN ){
          pNew->pLeft = p->pLeft;
          assert( p->pRight==0  || p->pRight==p->pLeft
                                || ExprHasProperty(p->pLeft, EP_Subquery) );
        }else{
          pNew->pLeft = sqlite3ExprDup(db, p->pLeft, 0);
        }
        pNew->pRight = sqlite3ExprDup(db, p->pRight, 0);
      }
    }
  }
  return pNew;
}